

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QPainterPath * __thiscall QRenderRule::borderClip(QRenderRule *this,QRect r)

{
  bool bVar1;
  int iVar2;
  QStyleSheetBorderData *pQVar3;
  QPainterPath *in_RDI;
  long in_FS_OFFSET;
  qreal qVar4;
  QPainterPath *this_00;
  QPainterPath *this_01;
  double startAngle;
  double w;
  qreal curX;
  qreal curY;
  int *borders;
  QPainterPath *path;
  QRectF rect;
  QSize brr;
  QSize blr;
  QSize trr;
  QSize tlr;
  QRenderRule *in_stack_fffffffffffffeb0;
  QRect *in_stack_fffffffffffffeb8;
  QPainterPath *arcLength;
  QRectF *in_stack_fffffffffffffec0;
  QPainterPath *in_stack_fffffffffffffec8;
  qreal in_stack_fffffffffffffed8;
  qreal in_stack_fffffffffffffee0;
  QPainterPath *x;
  QPainterPath *in_stack_fffffffffffffee8;
  QRectF local_58;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = hasBorder(in_stack_fffffffffffffeb0);
  if (bVar1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QSize::QSize((QSize *)in_stack_fffffffffffffeb0);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QSize::QSize((QSize *)in_stack_fffffffffffffeb0);
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QSize::QSize((QSize *)in_stack_fffffffffffffeb0);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    QSize::QSize((QSize *)in_stack_fffffffffffffeb0);
    pQVar3 = QSharedDataPointer<QStyleSheetBorderData>::operator->
                       ((QSharedDataPointer<QStyleSheetBorderData> *)in_stack_fffffffffffffeb0);
    qNormalizeRadii((QRect *)local_18,(QSize *)pQVar3->radii,(QSize *)&local_20,(QSize *)&local_28,
                    (QSize *)&local_30,(QSize *)&local_38);
    bVar1 = QSize::isNull((QSize *)in_stack_fffffffffffffec0);
    if ((((bVar1) && (bVar1 = QSize::isNull((QSize *)in_stack_fffffffffffffec0), bVar1)) &&
        (bVar1 = QSize::isNull((QSize *)in_stack_fffffffffffffec0), bVar1)) &&
       (bVar1 = QSize::isNull((QSize *)in_stack_fffffffffffffec0), bVar1)) {
      QPainterPath::QPainterPath(in_RDI);
    }
    else {
      local_58.xp = -NAN;
      local_58.yp = -NAN;
      local_58.w = -NAN;
      local_58.h = -NAN;
      QRectF::QRectF(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      pQVar3 = border((QRenderRule *)0x424f8b);
      *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
      QPainterPath::QPainterPath(in_RDI);
      qVar4 = QRectF::y(&local_58);
      this_00 = (QPainterPath *)(qVar4 + (double)pQVar3->borders[0] / 2.0);
      QRectF::x(&local_58);
      QSize::width((QSize *)0x425007);
      QPainterPath::moveTo
                (in_stack_fffffffffffffec8,(qreal)in_stack_fffffffffffffec0,
                 (qreal)in_stack_fffffffffffffeb8);
      QRectF::right(&local_58);
      QSize::width((QSize *)0x42504a);
      QPainterPath::lineTo
                (in_stack_fffffffffffffec8,(qreal)in_stack_fffffffffffffec0,
                 (qreal)in_stack_fffffffffffffeb8);
      qVar4 = QRectF::right(&local_58);
      this_01 = (QPainterPath *)(qVar4 - (double)pQVar3->borders[1] / 2.0);
      arcLength = this_01;
      iVar2 = QSize::width((QSize *)0x4250bd);
      startAngle = ((double)arcLength - (double)(iVar2 << 1)) + (double)pQVar3->borders[1];
      iVar2 = QSize::width((QSize *)0x425100);
      w = (double)(iVar2 * 2 - pQVar3->borders[1]);
      QSize::height((QSize *)0x425124);
      QPainterPath::arcTo(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffed8,w,(qreal)this_00,startAngle,(qreal)arcLength);
      x = this_01;
      qVar4 = QRectF::bottom(&local_58);
      QSize::height((QSize *)0x425192);
      QPainterPath::lineTo(this_00,startAngle,(qreal)arcLength);
      QRectF::bottom(&local_58);
      QSize::width((QSize *)0x425202);
      QSize::height((QSize *)0x425245);
      QSize::width((QSize *)0x425279);
      QSize::height((QSize *)0x42529d);
      QPainterPath::arcTo(this_01,(qreal)x,qVar4,w,(qreal)this_00,startAngle,(qreal)arcLength);
      QRectF::x(&local_58);
      QSize::width((QSize *)0x4252f8);
      QPainterPath::lineTo(this_00,startAngle,(qreal)arcLength);
      QRectF::left(&local_58);
      QRectF::bottom(&local_58);
      QSize::height((QSize *)0x42537e);
      QSize::width((QSize *)0x4253c1);
      QSize::height((QSize *)0x4253e8);
      QPainterPath::arcTo(this_01,(qreal)x,qVar4,w,(qreal)this_00,startAngle,(qreal)arcLength);
      QRectF::top(&local_58);
      QSize::height((QSize *)0x425463);
      QPainterPath::lineTo(this_00,startAngle,(qreal)arcLength);
      QRectF::top(&local_58);
      QSize::width((QSize *)0x4254db);
      QSize::height((QSize *)0x425502);
      QPainterPath::arcTo(this_01,(qreal)x,qVar4,w,(qreal)this_00,startAngle,(qreal)arcLength);
      QPainterPath::closeSubpath();
    }
  }
  else {
    QPainterPath::QPainterPath(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QPainterPath QRenderRule::borderClip(QRect r)
{
    if (!hasBorder())
        return QPainterPath();

    QSize tlr, trr, blr, brr;
    qNormalizeRadii(r, bd->radii, &tlr, &trr, &blr, &brr);
    if (tlr.isNull() && trr.isNull() && blr.isNull() && brr.isNull())
        return QPainterPath();

    const QRectF rect(r);
    const int *borders = border()->borders;
    QPainterPath path;
    qreal curY = rect.y() + borders[TopEdge]/2.0;
    path.moveTo(rect.x() + tlr.width(), curY);
    path.lineTo(rect.right() - trr.width(), curY);
    qreal curX = rect.right() - borders[RightEdge]/2.0;
    path.arcTo(curX - 2*trr.width() + borders[RightEdge], curY,
               trr.width()*2 - borders[RightEdge], trr.height()*2 - borders[TopEdge], 90, -90);

    path.lineTo(curX, rect.bottom() - brr.height());
    curY = rect.bottom() - borders[BottomEdge]/2.0;
    path.arcTo(curX - 2*brr.width() + borders[RightEdge], curY - 2*brr.height() + borders[BottomEdge],
               brr.width()*2 - borders[RightEdge], brr.height()*2 - borders[BottomEdge], 0, -90);

    path.lineTo(rect.x() + blr.width(), curY);
    curX = rect.left() + borders[LeftEdge]/2.0;
    path.arcTo(curX, rect.bottom() - 2*blr.height() + borders[BottomEdge]/2.0,
               blr.width()*2 - borders[LeftEdge], blr.height()*2 - borders[BottomEdge], 270, -90);

    path.lineTo(curX, rect.top() + tlr.height());
    path.arcTo(curX, rect.top() + borders[TopEdge]/2.0,
               tlr.width()*2 - borders[LeftEdge], tlr.height()*2 - borders[TopEdge], 180, -90);

    path.closeSubpath();
    return path;
}